

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O3

string * __thiscall verilogAST::If::toString_abi_cxx11_(string *__return_storage_ptr__,If *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  If *pIVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  pointer puVar7;
  pointer ppVar8;
  string local_108;
  If *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  pointer local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  local_c0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (**(((this->cond)._M_t.
       super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>.
       _M_t.
       super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
       .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)._vptr_Node
  )(&local_108);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
  paVar1 = &local_108.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  puVar7 = (this->true_body).
           super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->true_body).
           super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = this;
  if (puVar7 != puVar2) {
    do {
      (*(code *)**(undefined8 **)
                  (puVar7->_M_t).
                  super___uniq_ptr_impl<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::BehavioralStatement_*,_std::default_delete<verilogAST::BehavioralStatement>_>
                  .super__Head_base<0UL,_verilogAST::BehavioralStatement_*,_false>._M_head_impl)
                (&local_50);
      add_tab(&local_108,&local_50);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ppVar8 = (local_e8->else_ifs).
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (local_e8->else_ifs).
             super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 != local_b8) {
    do {
      (**(_func_int **)
         ((ppVar8->first)._M_t.
          super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
          ._M_t.
          super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
          .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)
                (local_b0);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x164c10);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_d0 = *plVar5;
        lStack_c8 = plVar4[3];
        local_e0 = &local_d0;
      }
      else {
        local_d0 = *plVar5;
        local_e0 = (long *)*plVar4;
      }
      local_d8 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_108.field_2._M_allocated_capacity = *psVar6;
        local_108.field_2._8_8_ = plVar4[3];
        local_108._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar6;
        local_108._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_108._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      puVar2 = (ppVar8->second).
               super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar7 = (ppVar8->second).
                    super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1
          ) {
        (*(code *)**(undefined8 **)
                    (puVar7->_M_t).
                    super___uniq_ptr_impl<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_verilogAST::BehavioralStatement_*,_std::default_delete<verilogAST::BehavioralStatement>_>
                    .super__Head_base<0UL,_verilogAST::BehavioralStatement_*,_false>._M_head_impl)
                  (&local_90);
        add_tab(&local_108,&local_90);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != local_b8);
  }
  pIVar3 = local_e8;
  if ((local_e8->else_body).
      super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_e8->else_body).
      super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar7 = (pIVar3->else_body).
             super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pIVar3->else_body).
             super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar7 != puVar2) {
      do {
        (*(code *)**(undefined8 **)
                    (puVar7->_M_t).
                    super___uniq_ptr_impl<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_verilogAST::BehavioralStatement_*,_std::default_delete<verilogAST::BehavioralStatement>_>
                    .super__Head_base<0UL,_verilogAST::BehavioralStatement_*,_false>._M_head_impl)
                  (&local_70);
        add_tab(&local_108,&local_70);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar2);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string If::toString() {
  std::string if_str = "";
  if_str += "if (";
  if_str += this->cond->toString();
  if_str += ") begin\n";

  for (auto &statement : this->true_body) {
    if_str += add_tab(statement->toString());
  }

  if_str += "end";

  for (auto &entry : this->else_ifs) {
    if_str += " else if (" + entry.first->toString() + ") begin\n";
    for (auto &statement : entry.second) {
      if_str += add_tab(statement->toString());
    }
    if_str += "end";
  }

  if (this->else_body.size()) {
    if_str += " else begin\n";
    for (auto &statement : else_body) {
      if_str += add_tab(statement->toString());
    }
    if_str += "end";
  }
  return if_str;
}